

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test3::writeMainBody
          (GPUShaderFP64Test3 *this,ostream *stream,shaderStage shader_stage)

{
  pointer puVar1;
  bool *pbVar2;
  ostream *poVar3;
  GPUShaderFP64Test3 *this_00;
  uint uVar4;
  pointer puVar5;
  uint uVar6;
  
  switch(shader_stage) {
  case FRAGMENT_SHADER:
    pbVar2 = (bool *)m_varying_name_fs_out_fs_result;
    break;
  case GEOMETRY_SHADER:
    pbVar2 = (bool *)m_varying_name_gs_fs_gs_result;
    break;
  case TESS_CONTROL_SHADER:
    pbVar2 = (bool *)m_varying_name_tcs_tes_tcs_result;
    break;
  case TESS_EVAL_SHADER:
    pbVar2 = (bool *)m_varying_name_tes_gs_tes_result;
    break;
  case VERTEX_SHADER:
    pbVar2 = (bool *)m_varying_name_vs_tcs_vs_result;
    break;
  default:
    pbVar2 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<(stream,"void main()\n{\n");
  if (shader_stage == TESS_CONTROL_SHADER) {
    std::operator<<(stream,
                    "gl_TessLevelOuter[0] = 1.0;\ngl_TessLevelOuter[1] = 1.0;\ngl_TessLevelOuter[2] = 1.0;\ngl_TessLevelOuter[3] = 1.0;\ngl_TessLevelInner[0] = 1.0;\ngl_TessLevelInner[1] = 1.0;\n\n"
                   );
  }
  puVar1 = (this->m_uniform_details).
           super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = 1;
  for (puVar5 = (this->m_uniform_details).
                super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar1 != puVar5; puVar5 = puVar5 + 1) {
    std::operator<<(stream,"    ");
    if (uVar6 != 1) {
      std::operator<<(stream,"else ");
    }
    poVar3 = std::operator<<(stream,"if (");
    poVar3 = std::operator<<(poVar3,puVar5->m_type_name);
    std::operator<<(poVar3,"(");
    uVar4 = 0;
    while (uVar4 < puVar5->m_n_elements) {
      std::ostream::_M_insert<double>
                ((this->m_base_element - (double)uVar4) * 0.25 +
                 (double)uVar6 * 13.0 + this->m_base_type_ordinal);
      uVar4 = uVar4 + 1;
      if (uVar4 != puVar5->m_n_elements) {
        std::operator<<(stream,", ");
      }
    }
    poVar3 = std::operator<<(stream,") != ");
    poVar3 = std::operator<<(poVar3,m_uniform_block_instance_name);
    poVar3 = std::operator<<(poVar3,".");
    poVar3 = std::operator<<(poVar3,puVar5->m_name);
    poVar3 = std::operator<<(poVar3,")\n    {\n        ");
    std::operator<<(poVar3,pbVar2);
    if (shader_stage == TESS_CONTROL_SHADER) {
      std::operator<<(stream,"[gl_InvocationID]");
    }
    poVar3 = std::operator<<(stream," = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,";\n");
    std::operator<<(poVar3,"    }\n");
    uVar6 = uVar6 + 1;
  }
  poVar3 = std::operator<<(stream,"    else\n    {\n        ");
  std::operator<<(poVar3,pbVar2);
  if (shader_stage == TESS_CONTROL_SHADER) {
    std::operator<<(stream,"[gl_InvocationID]");
  }
  poVar3 = std::operator<<(stream," = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,";\n");
  this_00 = (GPUShaderFP64Test3 *)std::operator<<(poVar3,"    }\n");
  std::operator<<((ostream *)this_00,"\n");
  writeVaryingPassthrough(this_00,stream,shader_stage);
  if (shader_stage == GEOMETRY_SHADER) {
    std::operator<<(stream,
                    "\ngl_Position = vec4(0.0f, 0.0f, 0.0f, 1.0f);EmitVertex();\nEndPrimitive();\n")
    ;
  }
  std::operator<<(stream,"}\n\n");
  return;
}

Assistant:

void GPUShaderFP64Test3::writeMainBody(std::ostream& stream, shaderStage shader_stage) const
{
	glw::GLuint		   type_ordinal = 1;
	const glw::GLchar* varying_name = "";

	/* Select name for varying that will hold result of "that" shader_stage */
	switch (shader_stage)
	{
	case FRAGMENT_SHADER:
		varying_name = m_varying_name_fs_out_fs_result;
		break;
	case GEOMETRY_SHADER:
		varying_name = m_varying_name_gs_fs_gs_result;
		break;
	case TESS_CONTROL_SHADER:
		varying_name = m_varying_name_tcs_tes_tcs_result;
		break;
	case TESS_EVAL_SHADER:
		varying_name = m_varying_name_tes_gs_tes_result;
		break;
	case VERTEX_SHADER:
		varying_name = m_varying_name_vs_tcs_vs_result;
		break;
	}

	/* void main() */
	stream << "void main()\n"
			  "{\n";

	/* Tesselation levels output */
	if (TESS_CONTROL_SHADER == shader_stage)
	{
		stream << "gl_TessLevelOuter[0] = 1.0;\n"
				  "gl_TessLevelOuter[1] = 1.0;\n"
				  "gl_TessLevelOuter[2] = 1.0;\n"
				  "gl_TessLevelOuter[3] = 1.0;\n"
				  "gl_TessLevelInner[0] = 1.0;\n"
				  "gl_TessLevelInner[1] = 1.0;\n"
				  "\n";
	}

	/* For each "double precision" uniform
	 *
	 * [else] if (TYPE_NAME(PREDIFINED_VALUES) != NAMED_UNIFORM_BLOCK_NAME.UNIFORM_NAME)
	 * {
	 *     VARYING_NAME = m_result_failure;
	 * }
	 */
	for (std::vector<uniformDetails>::const_iterator it = m_uniform_details.begin(), end = m_uniform_details.end();
		 end != it; ++it, ++type_ordinal)
	{
		stream << "    ";

		/* First comparison is done with if, next with else if */
		if (1 != type_ordinal)
		{
			stream << "else ";
		}

		/* if (TYPE_NAME( */
		stream << "if (" << it->m_type_name << "(";

		/* PREDIFINED_VALUES */
		for (glw::GLuint element = 0; element < it->m_n_elements; ++element)
		{
			stream << getExpectedValue(type_ordinal, element);

			/* Separate with comma */
			if (it->m_n_elements != element + 1)
			{
				stream << ", ";
			}
		}

		/*
		 * ) != NAMED_UNIFORM_BLOCK_NAME.UNIFORM_NAME)
		 * {
		 *     VARYING_NAME
		 */
		stream << ") != " << m_uniform_block_instance_name << "." << it->m_name << ")\n"
																				   "    {\n"
																				   "        "
			   << varying_name;

		/* Tesselation control outputs have to be arrays indexed with gl_InvocationID */
		if (TESS_CONTROL_SHADER == shader_stage)
		{
			stream << "[gl_InvocationID]";
		}

		/*
		 * = m_result_failure;
		 * }
		 */
		stream << " = " << m_result_failure << ";\n"
			   << "    }\n";
	}

	/* If all comparisons are ok
	 *
	 *     else
	 *     {
	 *         VARYING_NAME = m_result_success;
	 *     }
	 */

	/*
	 * else
	 * {
	 *     VARYING_NAME
	 */
	stream << "    else\n"
			  "    {\n"
			  "        "
		   << varying_name;

	/* Tesselation control outputs have to be arrays indexed with gl_InvocationID */
	if (TESS_CONTROL_SHADER == shader_stage)
	{
		stream << "[gl_InvocationID]";
	}

	/*
	 * = m_result_success;
	 * }
	 *
	 */
	stream << " = " << m_result_success << ";\n"
		   << "    }\n"
		   << "\n";

	/* For each pair of "input/output" varyings
	 *
	 * OUTPUT_VARYING_NAME = INPUT_VARYING_NAME;
	 **/
	writeVaryingPassthrough(stream, shader_stage);

	/* Geometry shader have to emit vertex */
	if (GEOMETRY_SHADER == shader_stage)
	{
		stream << "\n"
				  "gl_Position = vec4(0.0f, 0.0f, 0.0f, 1.0f);"
				  "EmitVertex();\n"
				  "EndPrimitive();\n";
	}

	/* Close scope of main */
	stream << "}\n\n";
}